

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O3

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  size_t sVar5;
  byte *pbVar6;
  ulong uVar7;
  
  sVar5 = input->size_;
  if ((long)sVar5 < 1) {
    return false;
  }
  pbVar1 = (byte *)(input->data_ + sVar5);
  uVar4 = 0;
  uVar7 = 0;
  pbVar3 = (byte *)input->data_;
  while( true ) {
    pbVar6 = pbVar3 + 1;
    sVar5 = sVar5 - 1;
    bVar2 = *pbVar3;
    if (-1 < (char)bVar2) {
      *value = (ulong)bVar2 << ((byte)uVar4 & 0x3f) | uVar7;
      input->data_ = (char *)pbVar6;
      input->size_ = sVar5;
      return true;
    }
    if (0x38 < uVar4) break;
    uVar7 = uVar7 | (ulong)(bVar2 & 0x7f) << ((byte)uVar4 & 0x3f);
    uVar4 = uVar4 + 7;
    pbVar3 = pbVar6;
    if (pbVar1 <= pbVar6) {
      return false;
    }
  }
  return false;
}

Assistant:

size_t size() const { return size_; }